

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman.c
# Opt level: O0

uint32_t calculate_value(char *raw,size_t *pos,size_t max)

{
  uint32_t uVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  uint32_t local_34;
  uint32_t value;
  size_t my_no;
  size_t max_local;
  size_t *pos_local;
  char *raw_local;
  
  sVar2 = numeral_no(raw[*pos]);
  if (sVar2 == 0) {
    raw_local._4_4_ = 0;
  }
  else {
    local_34 = ROMAN_VALUE[sVar2];
    while( true ) {
      bVar4 = false;
      if (*pos != 0) {
        sVar3 = numeral_no(raw[*pos - 1]);
        bVar4 = sVar3 < sVar2;
      }
      if (!bVar4) break;
      *pos = *pos - 1;
      uVar1 = calculate_value(raw,pos,sVar2);
      local_34 = local_34 - uVar1;
    }
    if ((*pos != 0) && (sVar2 = numeral_no(raw[*pos - 1]), sVar2 < max)) {
      *pos = *pos - 1;
      uVar1 = calculate_value(raw,pos,max);
      return local_34 + uVar1;
    }
    raw_local._4_4_ = local_34;
  }
  return raw_local._4_4_;
}

Assistant:

uint32_t calculate_value(const char* raw, size_t* pos, size_t max) {
  const size_t my_no = numeral_no(raw[*pos]);
  if (my_no == 0) return 0; // ERROR

  uint32_t value = ROMAN_VALUE[my_no];

  while (*pos > 0 && numeral_no(raw[*pos - 1]) < my_no) {
    *pos -= 1;
    value -= calculate_value(raw, pos, my_no);
  }

  if (*pos > 0 && numeral_no(raw[*pos - 1]) < max) {
    *pos -= 1;
    return value + calculate_value(raw, pos, max);
  } else {
    return value;
  }
}